

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_expression.cc
# Opt level: O2

shared_ptr<const_tchecker::typed_expression_t> __thiscall
tchecker::typed_binary_expression_t::right_operand_ptr(typed_binary_expression_t *this)

{
  shared_ptr<const_tchecker::typed_expression_t> sVar1;
  
  sVar1 = std::dynamic_pointer_cast<tchecker::typed_expression_t_const,tchecker::expression_t_const>
                    ((shared_ptr<const_tchecker::expression_t> *)this);
  sVar1.super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_typed_expression_t;
  return (shared_ptr<const_tchecker::typed_expression_t>)
         sVar1.super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<tchecker::typed_expression_t const> typed_binary_expression_t::right_operand_ptr() const
{
  return std::dynamic_pointer_cast<tchecker::typed_expression_t const>(tchecker::binary_expression_t::right_operand_ptr());
}